

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O3

string * __thiscall
Chart::renderMonth_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *previous,Datetime *day)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int month;
  stringstream out;
  char local_1c9;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  iVar1 = Datetime::month(previous);
  iVar2 = Datetime::month(day);
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (iVar1 == iVar2) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"   ","");
  }
  else {
    uVar3 = Datetime::month(day);
    Datetime::monthNameShort_abi_cxx11_(&local_1c8,(Datetime *)(ulong)uVar3,month);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  local_1c9 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_1c9,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderMonth (const Datetime& previous, const Datetime& day)
{
  const auto show_month = previous.month () != day.month ();

  std::stringstream out;

  out << (show_month ? Datetime::monthNameShort (day.month ()) : "   ")
      << ' ';

  return out.str ();
}